

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ResultBuilder::ExprComponents::~ExprComponents(ExprComponents *this)

{
  std::__cxx11::string::~string((string *)&this->op);
  std::__cxx11::string::~string((string *)&this->rhs);
  std::__cxx11::string::~string((string *)&this->lhs);
  return;
}

Assistant:

ExprComponents() : testFalse(false) {}